

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O1

bool __thiscall embree::TokenStream::trySymbol(TokenStream *this,string *symbol)

{
  char cVar1;
  ulong uVar2;
  int *piVar3;
  size_t n;
  bool bVar4;
  
  bVar4 = symbol->_M_string_length == 0;
  if (!bVar4) {
    cVar1 = *(symbol->_M_dataplus)._M_p;
    piVar3 = Stream<int>::peek((this->cin).ptr);
    if (*piVar3 == (int)cVar1) {
      uVar2 = 1;
      do {
        n = uVar2;
        Stream<int>::drop((this->cin).ptr);
        bVar4 = symbol->_M_string_length <= n;
        if (bVar4) {
          return bVar4;
        }
        cVar1 = (symbol->_M_dataplus)._M_p[n];
        piVar3 = Stream<int>::peek((this->cin).ptr);
        uVar2 = n + 1;
      } while (*piVar3 == (int)cVar1);
    }
    else {
      n = 0;
    }
    Stream<int>::unget((this->cin).ptr,n);
  }
  return bVar4;
}

Assistant:

bool TokenStream::trySymbol(const std::string& symbol)
  {
    size_t pos = 0;
    while (pos < symbol.size()) {
      if (symbol[pos] != cin->peek()) { cin->unget(pos); return false; }
      cin->drop(); pos++;
    }
    return true;
  }